

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::CMakeCmd_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  string_view source;
  const_reference this_00;
  pointer this_01;
  string *this_02;
  value_type *lgen;
  cmGlobalNinjaGenerator *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ::at(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,0);
  this_01 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                      (this_00);
  this_02 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  source = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_02);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (__return_storage_ptr__,&this_01->super_cmOutputConverter,source,SHELL,false);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::CMakeCmd() const
{
  const auto& lgen = this->LocalGenerators.at(0);
  return lgen->ConvertToOutputFormat(cmSystemTools::GetCMakeCommand(),
                                     cmOutputConverter::SHELL);
}